

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDComponentPtr __thiscall
ON_SubDComponentPtr::SetComponentDirection(ON_SubDComponentPtr *this,ON__UINT_PTR dir)

{
  ulong uVar1;
  
  uVar1 = this->m_ptr;
  if (dir == 1) {
    uVar1 = uVar1 | 1;
  }
  else if (dir == 0) {
    uVar1 = uVar1 & 0xfffffffffffffffe;
  }
  else {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x928,"","Invalid dir parameter");
  }
  return (ON_SubDComponentPtr)uVar1;
}

Assistant:

const ON_SubDComponentPtr ON_SubDComponentPtr::SetComponentDirection(ON__UINT_PTR dir) const
{
  ON_SubDComponentPtr component_ptr = *this;
  if (0 == dir)
    component_ptr.m_ptr &= ~((ON__UINT_PTR)ON_SUBD_COMPONENT_DIRECTION_MASK);
  else if (1 == dir)
    component_ptr.m_ptr |= ON_SUBD_COMPONENT_DIRECTION_MASK;
  else
    ON_SUBD_ERROR("Invalid dir parameter");
  return component_ptr;
}